

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  byte bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  void *pvVar4;
  SSL_SESSION *local_68;
  void *old_ssl_sessionid;
  int local_58;
  _Bool added;
  _Bool incache;
  int iStack_54;
  _Bool isproxy;
  int proxy_idx;
  int sockindex_idx;
  int connectdata_idx;
  int data_idx;
  curl_socket_t *sockindex_ptr;
  Curl_easy *pCStack_38;
  int sockindex;
  Curl_easy *data;
  connectdata *conn;
  SSL_SESSION *pSStack_20;
  int res;
  SSL_SESSION *ssl_sessionid_local;
  SSL *ssl_local;
  
  conn._4_4_ = 0;
  pSStack_20 = ssl_sessionid;
  ssl_sessionid_local = (SSL_SESSION *)ssl;
  sockindex_idx = ossl_get_ssl_data_index();
  proxy_idx = ossl_get_ssl_conn_index();
  iStack_54 = ossl_get_ssl_sockindex_index();
  local_58 = ossl_get_proxy_index();
  if ((((sockindex_idx < 0) || (proxy_idx < 0)) || (iStack_54 < 0)) || (local_58 < 0)) {
    ssl_local._4_4_ = 0;
  }
  else {
    data = (Curl_easy *)SSL_get_ex_data((SSL *)ssl_sessionid_local,proxy_idx);
    pCStack_38 = (Curl_easy *)SSL_get_ex_data((SSL *)ssl_sessionid_local,sockindex_idx);
    _connectdata_idx = SSL_get_ex_data((SSL *)ssl_sessionid_local,iStack_54);
    if (((data == (Curl_easy *)0x0) || (pCStack_38 == (Curl_easy *)0x0)) ||
       (_connectdata_idx == (void *)0x0)) {
      ssl_local._4_4_ = 0;
    }
    else {
      sockindex_ptr._4_4_ = (int)((long)_connectdata_idx - (long)&(data->set).writeheader >> 2);
      pvVar4 = SSL_get_ex_data((SSL *)ssl_sessionid_local,local_58);
      old_ssl_sessionid._7_1_ = pvVar4 != (void *)0x0;
      if (((char)(data->req).httpcode == '\x02') &&
         (*(int *)(&(data->set).fread_func_set +
                  (long)(int)(uint)(*(int *)((long)&(data->set).writeheader + 4) != -1) * 3) != 2))
      {
        bVar1 = (pCStack_38->set).proxy_ssl.primary.field_0x71;
      }
      else {
        bVar1 = (pCStack_38->set).ssl.primary.field_0x71;
      }
      if ((bVar1 >> 3 & 1) != 0) {
        old_ssl_sessionid._5_1_ = 0;
        local_68 = (SSL_SESSION *)0x0;
        Curl_ssl_sessionid_lock(pCStack_38);
        if ((old_ssl_sessionid._7_1_ & 1) == 0) {
          _Var2 = Curl_ssl_getsessionid
                            (pCStack_38,(connectdata *)data,(_Bool)(old_ssl_sessionid._7_1_ & 1),
                             &local_68,(size_t *)0x0,sockindex_ptr._4_4_);
          old_ssl_sessionid._6_1_ = (_Var2 ^ 0xffU) & 1;
        }
        else {
          old_ssl_sessionid._6_1_ = 0;
        }
        if ((old_ssl_sessionid._6_1_ != 0) && (local_68 != pSStack_20)) {
          Curl_infof(pCStack_38,"old SSL session ID is stale, removing");
          Curl_ssl_delsessionid(pCStack_38,local_68);
          old_ssl_sessionid._6_1_ = 0;
        }
        if (old_ssl_sessionid._6_1_ == 0) {
          CVar3 = Curl_ssl_addsessionid
                            (pCStack_38,(connectdata *)data,(_Bool)(old_ssl_sessionid._7_1_ & 1),
                             pSStack_20,0,sockindex_ptr._4_4_,
                             (_Bool *)((long)&old_ssl_sessionid + 5));
          if (CVar3 == CURLE_OK) {
            if ((old_ssl_sessionid._5_1_ & 1) != 0) {
              conn._4_4_ = 1;
            }
          }
          else {
            Curl_failf(pCStack_38,"failed to store ssl session");
          }
        }
        Curl_ssl_sessionid_unlock(pCStack_38);
      }
      ssl_local._4_4_ = conn._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  int res = 0;
  struct connectdata *conn;
  struct Curl_easy *data;
  int sockindex;
  curl_socket_t *sockindex_ptr;
  int data_idx = ossl_get_ssl_data_index();
  int connectdata_idx = ossl_get_ssl_conn_index();
  int sockindex_idx = ossl_get_ssl_sockindex_index();
  int proxy_idx = ossl_get_proxy_index();
  bool isproxy;

  if(data_idx < 0 || connectdata_idx < 0 || sockindex_idx < 0 || proxy_idx < 0)
    return 0;

  conn = (struct connectdata*) SSL_get_ex_data(ssl, connectdata_idx);
  data = (struct Curl_easy *) SSL_get_ex_data(ssl, data_idx);
  /* The sockindex has been stored as a pointer to an array element */
  sockindex_ptr = (curl_socket_t*) SSL_get_ex_data(ssl, sockindex_idx);
  if(!conn || !data || !sockindex_ptr)
    return 0;

  sockindex = (int)(sockindex_ptr - conn->sock);

  isproxy = SSL_get_ex_data(ssl, proxy_idx) ? TRUE : FALSE;

  if(SSL_SET_OPTION(primary.sessionid)) {
    bool incache;
    bool added = FALSE;
    void *old_ssl_sessionid = NULL;

    Curl_ssl_sessionid_lock(data);
    if(isproxy)
      incache = FALSE;
    else
      incache = !(Curl_ssl_getsessionid(data, conn, isproxy,
                                        &old_ssl_sessionid, NULL, sockindex));
    if(incache) {
      if(old_ssl_sessionid != ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing");
        Curl_ssl_delsessionid(data, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      if(!Curl_ssl_addsessionid(data, conn, isproxy, ssl_sessionid,
                                0 /* unknown size */, sockindex, &added)) {
        if(added) {
          /* the session has been put into the session cache */
          res = 1;
        }
      }
      else
        failf(data, "failed to store ssl session");
    }
    Curl_ssl_sessionid_unlock(data);
  }

  return res;
}